

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionPrintfStorageBuffer
          (ValidationState_t *_,Instruction *inst)

{
  Instruction *pIVar1;
  bool bVar2;
  uint uVar3;
  DiagnosticStream *pDVar4;
  DiagnosticStream local_5a8;
  DiagnosticStream local_3d0;
  DiagnosticStream local_1f8;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = inst;
  inst_local = (Instruction *)_;
  uVar3 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  bVar2 = IsUint32Constant(_,uVar3);
  pIVar1 = inst_local;
  if (bVar2) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(local_20,5);
    bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
    pIVar1 = inst_local;
    if (bVar2) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>(local_20,6);
      bVar2 = IsUint32Constant((ValidationState_t *)pIVar1,uVar3);
      if (bVar2) {
        __local._4_4_ = SPV_SUCCESS;
      }
      else {
        ValidationState_t::diag
                  (&local_5a8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
        pDVar4 = DiagnosticStream::operator<<(&local_5a8,(char (*) [50])0x63b698);
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream(&local_5a8);
      }
    }
    else {
      ValidationState_t::diag
                (&local_3d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
      pDVar4 = DiagnosticStream::operator<<
                         (&local_3d0,
                          (char (*) [53])"Binding must be a 32-bit unsigned integer OpConstant");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream(&local_3d0);
    }
  }
  else {
    ValidationState_t::diag
              (&local_1f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
    pDVar4 = DiagnosticStream::operator<<
                       (&local_1f8,
                        (char (*) [59])"DescriptorSet must be a 32-bit unsigned integer OpConstant")
    ;
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionPrintfStorageBuffer(
    ValidationState_t& _, const Instruction* inst) {
  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(4))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "DescriptorSet must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(5))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Binding must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(6))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Size must be a 32-bit unsigned integer OpConstant";
  }

  return SPV_SUCCESS;
}